

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::ParserRefImpl<double>
          (ParserRefImpl<Catch::Clara::Opt> *this,double *ref,string *hint)

{
  shared_ptr<Catch::Clara::Detail::BoundValueRef<double>_> local_30;
  string *local_20;
  string *hint_local;
  double *ref_local;
  ParserRefImpl<Catch::Clara::Opt> *this_local;
  
  local_20 = hint;
  hint_local = (string *)ref;
  ref_local = (double *)this;
  ComposableParserImpl<Catch::Clara::Opt>::ComposableParserImpl
            (&this->super_ComposableParserImpl<Catch::Clara::Opt>);
  (this->super_ComposableParserImpl<Catch::Clara::Opt>).super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__ParserRefImpl_00291e48;
  this->m_optionality = Optional;
  std::make_shared<Catch::Clara::Detail::BoundValueRef<double>,double&>((double *)&local_30);
  std::shared_ptr<Catch::Clara::Detail::BoundRef>::
  shared_ptr<Catch::Clara::Detail::BoundValueRef<double>,void>(&this->m_ref,&local_30);
  std::shared_ptr<Catch::Clara::Detail::BoundValueRef<double>_>::~shared_ptr(&local_30);
  std::__cxx11::string::string((string *)&this->m_hint,local_20);
  std::__cxx11::string::string((string *)&this->m_description);
  return;
}

Assistant:

ParserRefImpl( T& ref, std::string const& hint ):
                    m_ref( std::make_shared<BoundValueRef<T>>( ref ) ),
                    m_hint( hint ) {}